

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.h
# Opt level: O1

void __thiscall CCoinsCacheEntry::~CCoinsCacheEntry(CCoinsCacheEntry *this)

{
  long lVar1;
  CoinsCachePair *pCVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_flags != '\0') {
    pCVar2 = this->m_next;
    (pCVar2->second).m_prev = this->m_prev;
    (this->m_prev->second).m_next = pCVar2;
    this->m_flags = '\0';
  }
  if (0x1c < (this->coin).out.scriptPubKey.super_CScriptBase._size) {
    free((this->coin).out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    (this->coin).out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit CCoinsCacheEntry(Coin&& coin_) noexcept : coin(std::move(coin_)) {}